

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::PerformReconnections(CConnman *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  long in_FS_OFFSET;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> todo;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock106;
  _List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> local_58;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    local_58._M_impl._M_node._M_size = 0;
    local_40._M_owns = false;
    local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_58;
    local_58._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_58;
    local_40._M_device = &(this->m_reconnections_mutex).super_mutex;
    std::unique_lock<std::mutex>::lock(&local_40);
    p_Var2 = (this->m_reconnections).
             super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->m_reconnections) break;
    if (p_Var2->_M_next != (_List_node_base *)&local_58 && (_List_node_base *)&local_58 != p_Var2) {
      std::__detail::_List_node_base::_M_transfer((_List_node_base *)&local_58,p_Var2);
      local_58._M_impl._M_node._M_size = local_58._M_impl._M_node._M_size + 1;
      psVar1 = &(this->m_reconnections).
                super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (local_58._M_impl._M_node.super__List_node_base._M_next[6]._M_next == (_List_node_base *)0x0)
    {
      p_Var2 = (_List_node_base *)0x0;
    }
    else {
      p_Var2 = local_58._M_impl._M_node.super__List_node_base._M_next[5]._M_prev;
    }
    OpenNetworkConnection
              (this,(CAddress *)(local_58._M_impl._M_node.super__List_node_base._M_next + 1),false,
               (CSemaphoreGrant *)&local_58._M_impl._M_node.super__List_node_base._M_next[4]._M_prev
               ,(char *)p_Var2,
               *(ConnectionType *)&local_58._M_impl._M_node.super__List_node_base._M_next[7]._M_prev
               ,*(bool *)((long)&local_58._M_impl._M_node.super__List_node_base._M_next[7]._M_prev +
                         4));
    std::__cxx11::
    _List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::_M_clear
              (&local_58);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  std::__cxx11::_List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
  ::_M_clear(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::PerformReconnections()
{
    AssertLockNotHeld(m_reconnections_mutex);
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    while (true) {
        // Move first element of m_reconnections to todo (avoiding an allocation inside the lock).
        decltype(m_reconnections) todo;
        {
            LOCK(m_reconnections_mutex);
            if (m_reconnections.empty()) break;
            todo.splice(todo.end(), m_reconnections, m_reconnections.begin());
        }

        auto& item = *todo.begin();
        OpenNetworkConnection(item.addr_connect,
                              // We only reconnect if the first attempt to connect succeeded at
                              // connection time, but then failed after the CNode object was
                              // created. Since we already know connecting is possible, do not
                              // count failure to reconnect.
                              /*fCountFailure=*/false,
                              std::move(item.grant),
                              item.destination.empty() ? nullptr : item.destination.c_str(),
                              item.conn_type,
                              item.use_v2transport);
    }
}